

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  int in_EDX;
  stbrp_context *in_RSI;
  stbrp__findresult sVar1;
  stbrp__findresult fr;
  int all_rects_packed;
  int i;
  bool local_31;
  stbrp_node **local_28;
  int local_1c;
  int iVar2;
  
  local_1c = 1;
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    *(int *)&in_RSI->extra[(long)iVar2 + -2].field_0x4 = iVar2;
  }
  qsort(in_RSI,(long)in_EDX,0x10,rect_height_compare);
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    if ((*(short *)((long)&in_RSI->extra[(long)iVar2 + -3].next + 4) == 0) ||
       (*(short *)((long)&in_RSI->extra[(long)iVar2 + -3].next + 6) == 0)) {
      in_RSI->extra[(long)iVar2 + -2].y = 0;
      in_RSI->extra[(long)iVar2 + -2].x = 0;
    }
    else {
      sVar1 = stbrp__skyline_pack_rectangle(in_RSI,in_EDX,iVar2);
      local_28 = sVar1.prev_link;
      if (local_28 == (stbrp_node **)0x0) {
        in_RSI->extra[(long)iVar2 + -2].y = 0xffff;
        in_RSI->extra[(long)iVar2 + -2].x = 0xffff;
      }
      else {
        in_RSI->extra[(long)iVar2 + -2].x = (stbrp_coord)sVar1.x;
        in_RSI->extra[(long)iVar2 + -2].y = (stbrp_coord)sVar1.y;
      }
    }
  }
  qsort(in_RSI,(long)in_EDX,0x10,rect_original_order);
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    local_31 = false;
    if (in_RSI->extra[(long)iVar2 + -2].x == 0xffff) {
      local_31 = in_RSI->extra[(long)iVar2 + -2].y == 0xffff;
    }
    *(uint *)&in_RSI->extra[(long)iVar2 + -2].field_0x4 = (uint)((local_31 ^ 0xffU) & 1);
    if (*(int *)&in_RSI->extra[(long)iVar2 + -2].field_0x4 == 0) {
      local_1c = 0;
    }
  }
  return local_1c;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}